

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O1

Vec_Bit_t * Acec_BoothFindPPG(Gia_Man_t *p)

{
  uint uVar1;
  int *piVar2;
  Vec_Bit_t *pVVar3;
  int *__s;
  Vec_Int_t *__ptr;
  long lVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  pVVar3 = (Vec_Bit_t *)malloc(0x10);
  pVVar3->nSize = 0;
  iVar5 = iVar6 * 0x20;
  pVVar3->nCap = iVar5;
  if (iVar6 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar6 * 4);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = iVar5;
  memset(__s,0,(long)iVar6 << 2);
  __ptr = Acec_MultFindPPs(p);
  if (0 < __ptr->nSize) {
    piVar2 = __ptr->pArray;
    lVar4 = 0;
    do {
      uVar1 = piVar2[lVar4];
      if (((int)uVar1 < 0) || (iVar5 <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      __s[uVar1 >> 5] = __s[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
      lVar4 = lVar4 + 1;
    } while (lVar4 < __ptr->nSize);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  return pVVar3;
}

Assistant:

Vec_Bit_t * Acec_BoothFindPPG( Gia_Man_t * p )
{
    Vec_Bit_t * vIgnore = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vMap = Acec_MultFindPPs( p );
    int i, Entry;
    Vec_IntForEachEntry( vMap, Entry, i )
        Vec_BitWriteEntry( vIgnore, Entry, 1 );
    Vec_IntFree( vMap );
    return vIgnore;
}